

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hh
# Opt level: O1

string * __thiscall
kratos::Generator::external_filename_abi_cxx11_(string *__return_storage_ptr__,Generator *this)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pcVar3;
  
  pbVar1 = (this->lib_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->lib_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (pbVar1 == pbVar2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    pcVar3 = (pbVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + pbVar1->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string external_filename() const { return lib_files_.empty() ? "" : lib_files_[0]; }